

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

string * cinatra::press_tool::bytes_to_string_abi_cxx11_(uint64_t bytes)

{
  _Setprecision _Var1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  ulong in_RSI;
  string *in_RDI;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  stringstream ss;
  string suffix;
  double rt;
  char *in_stack_fffffffffffffdf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  stringstream local_1d0 [16];
  ostream local_1c0 [392];
  string local_38 [32];
  double local_18;
  ulong local_10;
  
  local_10 = in_RSI;
  std::__cxx11::string::string(in_stack_fffffffffffffe10);
  if (local_10 < 0x40000001) {
    if (local_10 < 0x100001) {
      if (local_10 < 0x401) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
        auVar6._8_4_ = (int)(local_10 >> 0x20);
        auVar6._0_8_ = local_10;
        auVar6._12_4_ = 0x45300000;
        local_18 = (auVar6._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)local_10) - 4503599627370496.0);
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
        auVar5._8_4_ = (int)(local_10 >> 0x20);
        auVar5._0_8_ = local_10;
        auVar5._12_4_ = 0x45300000;
        local_18 = ((auVar5._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)local_10) - 4503599627370496.0)) / 1024.0;
      }
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      auVar4._8_4_ = (int)(local_10 >> 0x20);
      auVar4._0_8_ = local_10;
      auVar4._12_4_ = 0x45300000;
      local_18 = ((auVar4._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)local_10) - 4503599627370496.0)) / 1048576.0;
    }
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    auVar3._8_4_ = (int)(local_10 >> 0x20);
    auVar3._0_8_ = local_10;
    auVar3._12_4_ = 0x45300000;
    local_18 = ((auVar3._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)local_10) - 4503599627370496.0)) / 1073741824.0;
  }
  std::__cxx11::stringstream::stringstream(local_1d0);
  poVar2 = (ostream *)std::ostream::operator<<(local_1c0,std::fixed);
  _Var1 = std::setprecision(3);
  poVar2 = std::operator<<(poVar2,_Var1);
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::ostream::operator<<(poVar2,local_18);
  std::operator<<((ostream *)this,local_38);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1d0);
  std::__cxx11::string::~string(this);
  return in_RDI;
}

Assistant:

inline std::string bytes_to_string(uint64_t bytes) {
  double rt;
  std::string suffix;
  if (bytes > GB_BYTE) {
    suffix = "GB";
    rt = (double(bytes) / GB_BYTE);
  }
  else if (bytes > MB_BYTE) {
    suffix = "MB";
    rt = (double(bytes) / MB_BYTE);
  }
  else if (bytes > KB_BYTE) {
    suffix = "KB";
    rt = (double(bytes) / KB_BYTE);
  }
  else {
    suffix = "bytes";
    rt = (double)bytes;
  }
  std::stringstream ss;
  ss << std::fixed << std::setprecision(3) << rt << suffix;
  return ss.str();
}